

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index ts,Index last_ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  value_type_conflict1 *__value;
  pointer ppJVar2;
  pointer psVar3;
  sp_counted_base *psVar4;
  _func_int *p_Var5;
  code *pcVar6;
  undefined8 uVar7;
  JointPolicyDiscretePure *pJVar8;
  stringstream *psVar9;
  JointPolicyPureVectorForClusteredBG *this_00;
  long *plVar10;
  element_type *this_01;
  pointer puVar11;
  pointer puVar12;
  _Alloc_hider _Var13;
  size_type sVar14;
  uint ts_00;
  PlanningUnitDecPOMDPDiscrete *pPVar15;
  int iVar16;
  Index ohIndex;
  Index IVar17;
  undefined4 extraout_var;
  pointer puVar18;
  TypeCluster *pTVar19;
  long lVar20;
  ulong uVar21;
  ostream *poVar22;
  _Base_ptr p_Var23;
  undefined4 in_register_0000000c;
  _Self __tmp;
  undefined1 *puVar24;
  ulong uVar25;
  Index IVar26;
  Index agentI;
  Index *oIs;
  undefined1 auStack_148 [8];
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_140;
  _Rb_tree_node_base *local_128;
  undefined1 *local_120;
  ulong local_118;
  JointPolicyDiscretePure *local_110;
  stringstream *local_108;
  ulong local_100;
  TypeCluster *local_f8;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *local_f0;
  JointPolicyPureVectorForClusteredBG *local_e8;
  ulong local_e0;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  element_type *local_b8;
  shared_count asStack_b0 [2];
  stringstream *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined8 local_80;
  string local_78;
  Index local_4c;
  uint local_48;
  Index local_44;
  PlanningUnitDecPOMDPDiscrete *local_40;
  ulong local_38;
  
  local_80 = CONCAT44(in_register_0000000c,ts);
  puVar24 = auStack_148;
  local_118 = (ulong)ts;
  ppJVar2 = (jpolBGVec->
            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_f0 = jpolBGVec;
  local_e8 = this;
  local_a0 = ss;
  local_4c = last_ts;
  local_40 = pu;
  if (((ulong)((long)(jpolBGVec->
                     super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar2 >> 3) <= local_118)
     || (psVar3 = (bgVec->
                  super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        (ulong)((long)(bgVec->
                      super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= local_118)
     ) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",local_118
              );
  }
  local_110 = ppJVar2[local_118];
  psVar4 = psVar3[local_118].pn.pi_;
  local_b8 = psVar3[local_118].px;
  asStack_b0[0].pi_ = psVar3[local_118].pn.pi_;
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar4->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_100 = (ulong)(ts - 1);
  local_108 = ss + 0x10;
  local_48 = ts + 1;
  local_38 = 0;
  while( true ) {
    p_Var5 = (local_40->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6];
    *(undefined8 *)(puVar24 + -8) = 0x382568;
    iVar16 = (*p_Var5)();
    uVar25 = local_38 & 0xffffffff;
    if (CONCAT44(extraout_var,iVar16) <= uVar25) {
      *(undefined8 *)(puVar24 + -8) = 0x3828f6;
      boost::detail::shared_count::~shared_count(asStack_b0);
      return;
    }
    puVar18 = (local_b8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_b8->super_BayesianGameForDecPOMDPStage).
                      super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
                      super_BayesianGameBase._m_nrTypes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar18 >> 3) <= uVar25) break;
    uVar21 = 0;
    local_e0 = uVar25;
    while( true ) {
      this_01 = local_b8;
      IVar26 = (Index)local_38;
      if (puVar18[local_e0] <= uVar21) break;
      local_44 = (Index)uVar21;
      *(undefined8 *)(puVar24 + -8) = 0x3825c3;
      pTVar19 = BayesianGameWithClusterInfo::GetTypeCluster(this_01,IVar26,(Index)uVar21);
      p_Var23 = (pTVar19->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_128 = &(pTVar19->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var23 != local_128) {
        do {
          local_f8 = pTVar19;
          lVar20 = *(long *)(p_Var23 + 1);
          if (*(int *)(lVar20 + 8) == 1) {
            *(undefined8 *)(puVar24 + -8) = 0x382608;
            lVar20 = __dynamic_cast(lVar20,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
            uVar25 = local_38;
            pPVar15 = local_40;
            IVar26 = *(Index *)(lVar20 + 0xc);
            uVar21 = local_118 * 4 + 0xf & 0xfffffffffffffff0;
            oIs = (Index *)((long)(puVar24 + -uVar21) - uVar21);
            IVar17 = (Index)local_80;
            local_120 = puVar24;
            oIs[-2] = 0x382652;
            oIs[-1] = 0;
            PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                      (&pPVar15->super_PlanningUnitMADPDiscrete,(Index)uVar25,IVar26,IVar17,
                       (Index *)(puVar24 + -uVar21),oIs);
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (IVar17 != 0) {
              __value = oIs + local_100;
              oIs[-2] = 0x382689;
              oIs[-1] = 0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                         (ulong)*oIs,__value,(allocator_type *)&local_d8);
              puVar12 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar11 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_78.field_2._M_allocated_capacity;
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_78._M_dataplus._M_p;
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_78._M_string_length;
              local_78._0_16_ = ZEXT816(0) << 0x20;
              local_78.field_2._M_allocated_capacity = 0;
              if (puVar11 != (pointer)0x0) {
                oIs[-2] = 0x3826c7;
                oIs[-1] = 0;
                operator_delete(puVar11,(long)puVar12 - (long)puVar11);
              }
              _Var13._M_p = local_78._M_dataplus._M_p;
              if ((pointer)local_78._M_dataplus._M_p != (pointer)0x0) {
                uVar25 = local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p;
                oIs[-2] = 0x3826dc;
                oIs[-1] = 0;
                operator_delete(_Var13._M_p,uVar25);
              }
            }
            uVar25 = local_38;
            pPVar15 = local_40;
            uVar7 = local_80;
            agentI = (Index)local_38;
            oIs[-2] = 0x3826f7;
            oIs[-1] = 0;
            ohIndex = PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                                (&pPVar15->super_PlanningUnitMADPDiscrete,agentI,(Index)uVar7,
                                 &local_98);
            IVar17 = local_44;
            pJVar8 = local_110;
            pcVar6 = *(code **)((long)(local_110->super_JointPolicyDiscrete).super_JointPolicy.
                                      _vptr_JointPolicy + 0x98);
            oIs[-2] = 0x382710;
            oIs[-1] = 0;
            IVar17 = (*pcVar6)(pJVar8,uVar25 & 0xffffffff,IVar17);
            pPVar15 = local_40;
            oIs[-2] = 0x382726;
            oIs[-1] = 0;
            PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
                      (&local_78,&pPVar15->super_PlanningUnitMADPDiscrete,agentI,ohIndex);
            psVar9 = local_108;
            _Var13._M_p = local_78._M_dataplus._M_p;
            sVar14 = local_78._M_string_length;
            oIs[-2] = 0x38273a;
            oIs[-1] = 0;
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)psVar9,_Var13._M_p,sVar14);
            oIs[-2] = 0x382751;
            oIs[-1] = 0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar22," -> ",4);
            uVar25 = local_38;
            pPVar15 = local_40;
            p_Var5 = (local_40->super_PlanningUnitMADPDiscrete).super_PlanningUnit.
                     _vptr_PlanningUnit[0xc];
            oIs[-2] = 0x382769;
            oIs[-1] = 0;
            (*p_Var5)(&local_d8,pPVar15,uVar25);
            lVar20 = local_d0;
            plVar10 = local_d8;
            oIs[-2] = 0x38277f;
            oIs[-1] = 0;
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar22,(char *)plVar10,lVar20);
            uVar7 = *(undefined8 *)(*(long *)poVar22 + -0x18);
            oIs[-2] = 0x382796;
            oIs[-1] = 0;
            std::ios::widen((char)uVar7 + (char)poVar22);
            oIs[-2] = 0x3827a1;
            oIs[-1] = 0;
            std::ostream::put((char)poVar22);
            oIs[-2] = 0x3827a9;
            oIs[-1] = 0;
            std::ostream::flush();
            plVar10 = local_d8;
            if (local_d8 != local_c8) {
              uVar25 = local_c8[0] + 1;
              oIs[-2] = 0x3827cb;
              oIs[-1] = 0;
              operator_delete(plVar10,uVar25);
            }
            _Var13._M_p = local_78._M_dataplus._M_p;
            if (local_78._M_dataplus._M_p != (pointer)((long)&local_78 + 0x10)) {
              uVar25 = local_78.field_2._M_allocated_capacity + 1;
              oIs[-2] = 0x3827e4;
              oIs[-1] = 0;
              operator_delete(_Var13._M_p,uVar25);
            }
            if (local_48 <= local_4c) {
              oIs[-2] = 0x3827fc;
              oIs[-1] = 0;
              std::
              vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              ::vector(&local_140,bgVec);
              uVar25 = local_38;
              *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                **)(oIs + -4) = &local_140;
              *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                **)(oIs + -6) = local_f0;
              oIs[-8] = IVar17;
              *(TypeCluster **)(oIs + -0xc) = local_f8;
              oIs[-0xe] = ohIndex;
              oIs[-0x10] = IVar26;
              pPVar15 = local_40;
              ts_00 = local_48;
              IVar26 = local_4c;
              psVar9 = local_a0;
              this_00 = local_e8;
              oIs[-0x12] = 0x382855;
              oIs[-0x11] = 0;
              RecursivelyPrintPolicyForAgent
                        (this_00,pPVar15,psVar9,(Index)uVar25,ts_00,IVar26,oIs[-0x10],oIs[-0xe],
                         *(TypeCluster **)(oIs + -0xc),oIs[-10],oIs[-8],
                         *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                           **)(oIs + -6),
                         *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                           **)(oIs + -4));
              oIs[-2] = 0x382861;
              oIs[-1] = 0;
              std::
              vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              ::~vector(&local_140);
            }
            oIs[-2] = 0x382869;
            oIs[-1] = 0;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
            puVar11 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar24 = local_120;
            if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              uVar25 = (long)local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage -
                       (long)local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
              oIs[-2] = 0x382884;
              oIs[-1] = 0;
              operator_delete(puVar11,uVar25);
              puVar24 = local_120;
            }
          }
          else {
            *(undefined8 *)(puVar24 + -8) = 0x382895;
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
          }
          pTVar19 = local_f8;
        } while (p_Var23 != local_128);
      }
      uVar21 = (ulong)(local_44 + 1);
      puVar18 = (local_b8->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_b8->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface
                        .super_BayesianGameBase._m_nrTypes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar18 >> 3) <= local_e0)
      goto LAB_00382905;
    }
    local_38 = (ulong)(IVar26 + 1);
  }
LAB_00382905:
  *(undefined8 *)(puVar24 + -8) = 0x382913;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index ts
        , Index last_ts
        , const vector<const JointPolicyDiscretePure *>& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
        )const 
{
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure*  jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                {
                    //throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveSoftPrintPerAgent - expected an AOHINDEX type");
                    it++;
                    continue;
                }
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                ss << pu->SoftPrintObservationHistory(agI, ohI) << " -> " <<
                    pu->SoftPrintAction(agI, aI) << endl;

                if(ts+1 <= last_ts)
                    RecursivelyPrintPolicyForAgent(
                        pu, ss, agI, ts+1, last_ts, aohI, 
                        ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}